

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O1

int csrMain(int argc,char **argv)

{
  int iVar1;
  err_t code;
  bool_t bVar2;
  int iVar3;
  err_t eVar4;
  octet *privkey;
  char *pcVar5;
  int iVar6;
  char **ppcVar7;
  char **ppcVar8;
  octet *csr;
  int iVar9;
  bool bVar10;
  cmd_pwd_t pwd;
  size_t privkey_len;
  cmd_pwd_t local_48;
  size_t local_40;
  size_t local_38;
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  csr rewrap -pass <schema> <privkey> <csr> <csr1>\n    rewrap <csr> using <privkey> and store the result in <csr1>\n  csr val <csr>\n    validate <csr>\n  options:\n    -pass <schema> -- password description\n\\warning implemented only with bign-curve256v1\n"
           ,"csr","manage certificate signing requests");
    return -1;
  }
  iVar1 = strCmp(argv[1],"rewrap");
  if (iVar1 == 0) {
    eVar4 = 0;
    local_48 = (cmd_pwd_t)0x0;
    local_38 = 0;
    code = cmdStDo(8);
    if (code != 0) goto LAB_00108ed6;
    ppcVar7 = argv + 2;
    iVar1 = argc + -2;
    if (iVar1 == 0) {
      bVar10 = true;
    }
    else {
      iVar9 = argc + -3;
      do {
        bVar2 = strStartsWith(*ppcVar7,"-");
        ppcVar8 = ppcVar7;
        if (bVar2 == 0) {
          eVar4 = 0;
          iVar6 = iVar9 + 1;
          goto LAB_00108e66;
        }
        iVar3 = strCmp(*ppcVar7,"-pass");
        eVar4 = 0x25b;
        iVar6 = iVar1;
        if (iVar3 != 0) goto LAB_00108e66;
        if (local_48 != (cmd_pwd_t)0x0) {
          eVar4 = 0x25c;
          goto LAB_00108e66;
        }
        ppcVar8 = ppcVar7 + 1;
        if (iVar9 == 0) {
          iVar6 = 0;
          goto LAB_00108e66;
        }
        eVar4 = cmdPwdRead(&local_48,*ppcVar8);
        iVar6 = iVar9;
        if (eVar4 != 0) goto LAB_00108e66;
        ppcVar7 = ppcVar7 + 2;
        iVar1 = iVar1 + -2;
        iVar9 = iVar9 + -2;
      } while (iVar9 != -1);
      eVar4 = 0;
      ppcVar8 = ppcVar7;
      iVar6 = 0;
LAB_00108e66:
      bVar10 = iVar6 != 3;
      ppcVar7 = ppcVar8;
    }
    code = 0;
    if (local_48 == (cmd_pwd_t)0x0) {
      code = 0x25b;
    }
    if (bVar10) {
      code = 0x25b;
    }
    if (eVar4 != 0) {
      code = eVar4;
    }
    if ((code == 0) && (code = cmdFileValExist(2,ppcVar7), code == 0)) {
      code = cmdFileValNotExist(1,ppcVar7 + 2);
      if ((code == 0) &&
         (code = cmdPrivkeyRead((octet *)0x0,&local_38,*ppcVar7,local_48), code == 0)) {
        code = cmdFileReadAll((void *)0x0,&local_40,ppcVar7[1]);
        if (code != 0) goto LAB_00108ed6;
        privkey = (octet *)blobCreate(local_40 + local_38);
        if (privkey != (octet *)0x0) {
          csr = privkey + local_38;
          code = cmdPrivkeyRead(privkey,&local_38,*ppcVar7,local_48);
          cmdPwdClose(local_48);
          if (code == 0) {
            code = cmdFileReadAll(csr,&local_40,ppcVar7[1]);
            if (code != 0) goto LAB_00108ed6;
            code = bpkiCSRRewrap(csr,local_40,privkey,local_38);
            if (code == 0) {
              code = cmdFileWrite(ppcVar7[2],csr,local_40);
            }
          }
          goto LAB_00108da2;
        }
        cmdPwdClose(local_48);
        goto LAB_00108f8e;
      }
    }
    cmdPwdClose(local_48);
  }
  else {
    iVar1 = strCmp(argv[1],"val");
    code = 0x259;
    if ((iVar1 != 0) || (code = cmdStDo(8), code != 0)) goto LAB_00108ed6;
    ppcVar7 = argv + 2;
    code = cmdFileValExist(1,ppcVar7);
    if ((code != 0) || (code = cmdFileReadAll((void *)0x0,(size_t *)&local_48,*ppcVar7), code != 0))
    goto LAB_00108ed6;
    privkey = (octet *)blobCreate((size_t)local_48);
    if (privkey != (octet *)0x0) {
      code = cmdFileReadAll(privkey,(size_t *)&local_48,*ppcVar7);
      if (code == 0) {
        code = bpkiCSRUnwrap((octet *)0x0,(size_t *)0x0,privkey,(size_t)local_48);
      }
LAB_00108da2:
      blobClose(privkey);
      goto LAB_00108ed6;
    }
LAB_00108f8e:
    code = 0x6e;
  }
LAB_00108ed6:
  if ((code != 0) || (iVar1 = strCmp(argv[1],"val"), iVar1 == 0)) {
    pcVar5 = errMsg(code);
    printf("bee2cmd/%s: %s\n","csr",pcVar5);
  }
  return -(uint)(code != 0);
}

Assistant:

int csrMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return csrUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "rewrap"))
		code = csrRewrap(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = csrVal(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}